

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupTrimmed2(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManCreateRefs(p);
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ObjRefFanin0Dec(p,pGStack_20);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if ((!bVar5) || (iVar1 = Gia_ObjRefNum(p,pGStack_20), iVar1 != 0)) break;
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManPiNum(p);
  if (local_24 == iVar1) {
    Gia_ManAppendCi(p_00);
  }
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjRefNum(p,pGStack_20);
    if ((iVar1 != 0) || (iVar1 = Gia_ObjIsRo(p,pGStack_20), iVar1 != 0)) {
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar5 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      iLit1 = Gia_ObjFanin1Copy(pGStack_20);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pGVar4 = Gia_ObjFanin0(pGStack_20);
    iVar1 = Gia_ObjIsConst0(pGVar4);
    if (iVar1 == 0) {
      pGVar4 = Gia_ObjFanin0(pGStack_20);
      iVar1 = Gia_ObjIsPi(p,pGVar4);
      if (iVar1 == 0) break;
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManPoNum(p);
  if (local_24 == iVar1) {
    Gia_ManAppendCo(p_00,0);
  }
  local_24 = 0;
  do {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) {
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      iVar1 = Gia_ManHasDangling(p_00);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ManHasDangling( pNew )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x8f7,"Gia_Man_t *Gia_ManDupTrimmed2(Gia_Man_t *)");
      }
      return p_00;
    }
    pGVar4 = Gia_ObjFanin0(pGStack_20);
    iVar1 = Gia_ObjIsConst0(pGVar4);
    if (iVar1 == 0) {
      pGVar4 = Gia_ObjFanin0(pGStack_20);
      iVar1 = Gia_ObjIsPi(p,pGVar4);
      if (iVar1 != 0) goto LAB_001eae32;
LAB_001eae44:
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      Gia_ManAppendCo(p_00,iVar1);
    }
    else {
LAB_001eae32:
      iVar1 = Gia_ObjIsRi(p,pGStack_20);
      if (iVar1 != 0) goto LAB_001eae44;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    // discount references of POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ObjRefFanin0Dec( p, pObj );
    // check if PIs are left
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // check if there are POs to be added
    Gia_ManForEachPo( p, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj)) )
            break;
    if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManForEachCo( p, pObj, i )
        if ( (!Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj))) || Gia_ObjIsRi(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}